

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

int __thiscall
xercesc_4_0::TraverseSchema::changeRedefineGroup
          (TraverseSchema *this,DOMElement *redefineChildElem,XMLCh *redefineChildComponentName,
          XMLCh *redefineChildTypeName,int redefineNameCounter)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  XMLCh *pXVar4;
  XMLCh *pXVar5;
  XMLCh *pXVar6;
  XMLCh *maxOccurs;
  XMLCh *minOccurs;
  XMLCh *uriStr;
  XMLCh *localPart;
  XMLCh *prefix;
  XMLCh *refName;
  XMLCh *name;
  DOMElement *child;
  int result;
  int redefineNameCounter_local;
  XMLCh *redefineChildTypeName_local;
  XMLCh *redefineChildComponentName_local;
  DOMElement *redefineChildElem_local;
  TraverseSchema *this_local;
  
  child._0_4_ = 0;
  for (name = (XMLCh *)XUtil::getFirstChildElement(&redefineChildElem->super_DOMNode);
      name != (XMLCh *)0x0; name = (XMLCh *)XUtil::getNextSiblingElement((DOMNode *)name)) {
    pXVar4 = (XMLCh *)(**(code **)(*(long *)name + 0xc0))();
    bVar1 = XMLString::equals(pXVar4,(XMLCh *)SchemaSymbols::fgELT_ANNOTATION);
    if (!bVar1) {
      bVar1 = XMLString::equals(pXVar4,redefineChildComponentName);
      if (bVar1) {
        pXVar4 = getElementAttValue(this,(DOMElement *)name,L"ref",QName);
        if ((pXVar4 != (XMLCh *)0x0) && (*pXVar4 != L'\0')) {
          pXVar5 = getPrefix(this,pXVar4);
          pXVar6 = getLocalPart(this,pXVar4);
          pXVar5 = resolvePrefixToURI(this,(DOMElement *)name,pXVar5);
          iVar2 = this->fTargetNSURI;
          iVar3 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                            (this->fURIStringPool,pXVar5);
          if (iVar2 == iVar3) {
            iVar2 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[5])
                              (this->fStringPool,pXVar6);
            iVar3 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[5])
                              (this->fStringPool,redefineChildTypeName);
            if (iVar2 == iVar3) {
              getRedefineNewTypeName(this,pXVar4,redefineNameCounter,&this->fBuffer);
              pXVar4 = XMLBuffer::getRawBuffer(&this->fBuffer);
              (**(code **)(*(long *)name + 0x160))(name,&SchemaSymbols::fgATT_REF,pXVar4);
              child._0_4_ = (int)child + 1;
              bVar1 = XMLString::equals(redefineChildComponentName,
                                        (XMLCh *)SchemaSymbols::fgELT_GROUP);
              if (bVar1) {
                pXVar4 = getElementAttValue(this,(DOMElement *)name,
                                            (XMLCh *)SchemaSymbols::fgATT_MINOCCURS,Decimal);
                pXVar5 = getElementAttValue(this,(DOMElement *)name,
                                            (XMLCh *)SchemaSymbols::fgATT_MAXOCCURS,Decimal);
                if ((((pXVar5 != (XMLCh *)0x0) && (*pXVar5 != L'\0')) &&
                    (bVar1 = XMLString::equals(pXVar5,L"1"), !bVar1)) ||
                   (((pXVar4 != (XMLCh *)0x0 && (*pXVar4 != L'\0')) &&
                    (bVar1 = XMLString::equals(pXVar4,L"1"), !bVar1)))) {
                  reportSchemaError(this,(DOMElement *)name,(XMLCh *)XMLUni::fgXMLErrDomain,0x7c,
                                    redefineChildTypeName,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
                }
              }
            }
          }
        }
      }
      else {
        iVar2 = changeRedefineGroup(this,(DOMElement *)name,redefineChildComponentName,
                                    redefineChildTypeName,redefineNameCounter);
        child._0_4_ = iVar2 + (int)child;
      }
    }
  }
  return (int)child;
}

Assistant:

int TraverseSchema::changeRedefineGroup(const DOMElement* const redefineChildElem,
                                        const XMLCh* const redefineChildComponentName,
                                        const XMLCh* const redefineChildTypeName,
                                        const int redefineNameCounter) {
    int result = 0;
    DOMElement* child = XUtil::getFirstChildElement(redefineChildElem);

    for (; child != 0; child = XUtil::getNextSiblingElement(child)) {

        const XMLCh* name = child->getLocalName();

        if (XMLString::equals(name, SchemaSymbols::fgELT_ANNOTATION)) {
            continue;
        }

        if (!XMLString::equals(name, redefineChildComponentName)) {
            result += changeRedefineGroup(child, redefineChildComponentName, redefineChildTypeName, redefineNameCounter);
        } else {
            const XMLCh* refName = getElementAttValue(child, SchemaSymbols::fgATT_REF, DatatypeValidator::QName);

            if (refName && *refName) {

                const XMLCh* prefix = getPrefix(refName);
                const XMLCh* localPart = getLocalPart(refName);
                const XMLCh* uriStr = resolvePrefixToURI(child, prefix);

                if (fTargetNSURI == (int) fURIStringPool->addOrFind(uriStr)
                    && fStringPool->addOrFind(localPart) == fStringPool->addOrFind(redefineChildTypeName)) {

                    // now we have to do the renaming...
                    getRedefineNewTypeName(refName, redefineNameCounter, fBuffer);
                    child->setAttribute(SchemaSymbols::fgATT_REF, fBuffer.getRawBuffer());
                    result++;

                    if(XMLString::equals(redefineChildComponentName, SchemaSymbols::fgELT_GROUP)) {

                        const XMLCh* minOccurs = getElementAttValue(child, SchemaSymbols::fgATT_MINOCCURS, DatatypeValidator::Decimal);
                        const XMLCh* maxOccurs = getElementAttValue(child, SchemaSymbols::fgATT_MAXOCCURS, DatatypeValidator::Decimal);

                        if (((maxOccurs && *maxOccurs) && !XMLString::equals(maxOccurs, fgValueOne))
                            || ((minOccurs && *minOccurs) && !XMLString::equals(minOccurs, fgValueOne))) {
                            reportSchemaError(child, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_InvalidGroupMinMax, redefineChildTypeName);
                        }
                    }
                }
            } // if ref was null some other stage of processing will flag the error
        }
    }

    return result;
}